

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_rounding_unconditional(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  int i;
  int iVar17;
  float *pfVar18;
  int iVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  float *pfVar27;
  float *pfVar28;
  uint uVar29;
  float *pfVar30;
  ulong uVar31;
  ulong uVar32;
  int k_count;
  long lVar33;
  int l_count;
  long lVar34;
  float *pfVar35;
  float *pfVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [64];
  float fVar56;
  undefined1 in_ZMM7 [64];
  float fVar57;
  undefined1 auVar58 [16];
  
  fVar49 = ipoint->scale;
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar44._8_4_ = 0x80000000;
  auVar44._0_8_ = 0x8000000080000000;
  auVar44._12_4_ = 0x80000000;
  auVar37 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)fVar49),auVar44,0xf8);
  auVar38 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->y),auVar44,0xf8);
  auVar37 = ZEXT416((uint)(fVar49 + auVar37._0_4_));
  auVar41 = vroundss_avx(auVar37,auVar37,0xb);
  auVar37 = ZEXT416((uint)(ipoint->y + auVar38._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->x),auVar44,0xf8);
  auVar43._0_8_ = (double)auVar37._0_4_;
  auVar43._8_8_ = auVar37._8_8_;
  auVar39._0_8_ = (double)fVar49;
  auVar39._8_8_ = 0;
  auVar37 = ZEXT416((uint)(ipoint->x + auVar38._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar42._0_8_ = (double)auVar37._0_4_;
  auVar42._8_8_ = auVar37._8_8_;
  auVar38 = vfmadd231sd_fma(auVar43,auVar39,ZEXT816(0x3fe0000000000000));
  auVar42 = vfmadd231sd_fma(auVar42,auVar39,ZEXT816(0x3fe0000000000000));
  auVar37._0_4_ = (int)auVar41._0_4_;
  auVar37._4_4_ = (int)auVar41._4_4_;
  auVar37._8_4_ = (int)auVar41._8_4_;
  auVar37._12_4_ = (int)auVar41._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  iVar17 = -0xc;
  lVar24 = 0;
  for (lVar34 = 0; lVar34 != 0x18; lVar34 = lVar34 + 1) {
    auVar47._0_4_ = (float)iVar17;
    auVar47._4_12_ = in_ZMM7._4_12_;
    lVar33 = 0;
    auVar43 = vfmadd132ss_fma(auVar47,ZEXT416((uint)((float)auVar38._0_8_ - auVar37._0_4_)),
                              ZEXT416((uint)fVar49));
    auVar52._8_4_ = 0x3effffff;
    auVar52._0_8_ = 0x3effffff3effffff;
    auVar52._12_4_ = 0x3effffff;
    auVar46._8_4_ = 0x80000000;
    auVar46._0_8_ = 0x8000000080000000;
    auVar46._12_4_ = 0x80000000;
    auVar39 = vpternlogd_avx512vl(auVar52,auVar43,auVar46,0xf8);
    auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar39._0_4_));
    auVar43 = vroundss_avx(auVar43,auVar43,0xb);
    lVar23 = lVar24;
    for (; lVar33 != 0x18; lVar33 = lVar33 + 1) {
      auVar50._0_4_ = (float)((int)lVar33 + -0xc);
      auVar50._4_12_ = in_ZMM7._4_12_;
      auVar39 = vfmadd132ss_fma(auVar50,ZEXT416((uint)((float)auVar42._0_8_ - auVar37._0_4_)),
                                ZEXT416((uint)fVar49));
      auVar53._8_4_ = 0x3effffff;
      auVar53._0_8_ = 0x3effffff3effffff;
      auVar53._12_4_ = 0x3effffff;
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar40 = vpternlogd_avx512vl(auVar53,auVar39,auVar16,0xf8);
      auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
      auVar39 = vroundss_avx(auVar39,auVar39,0xb);
      haarXY_unconditional
                (iimage,(int)auVar43._0_4_,(int)auVar39._0_4_,(int)auVar41._0_4_,
                 (float *)((long)haarResponseX + lVar23),(float *)((long)haarResponseY + lVar23));
      lVar23 = lVar23 + 4;
    }
    iVar17 = iVar17 + 1;
    lVar24 = lVar24 + 0x60;
  }
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  fVar57 = -0.08 / (fVar49 * fVar49);
  auVar37 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 0.5)),auVar48,0xf8);
  auVar37 = ZEXT416((uint)(fVar49 * 0.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar41 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 1.5)),auVar48,0xf8);
  auVar41 = ZEXT416((uint)(fVar49 * 1.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar38 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 2.5)),auVar48,0xf8);
  auVar38 = ZEXT416((uint)(fVar49 * 2.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar42 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 3.5)),auVar48,0xf8);
  auVar42 = ZEXT416((uint)(fVar49 * 3.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 4.5)),auVar48,0xf8);
  auVar43 = ZEXT416((uint)(fVar49 * 4.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar39 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 5.5)),auVar48,0xf8);
  auVar39 = ZEXT416((uint)(fVar49 * 5.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 6.5)),auVar48,0xf8);
  auVar40 = ZEXT416((uint)(fVar49 * 6.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar44 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 7.5)),auVar48,0xf8);
  auVar44 = ZEXT416((uint)(auVar44._0_4_ + fVar49 * 7.5));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 8.5)),auVar48,0xf8);
  auVar45 = ZEXT416((uint)(fVar49 * 8.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 9.5)),auVar48,0xf8);
  auVar46 = ZEXT416((uint)(fVar49 * 9.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 10.5)),auVar48,0xf8);
  auVar47 = ZEXT416((uint)(fVar49 * 10.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)(fVar49 * 11.5)),auVar48,0xf8);
  fVar54 = auVar38._0_4_;
  fVar3 = fVar54 + auVar41._0_4_;
  fVar4 = fVar54 + auVar37._0_4_;
  auVar38 = ZEXT416((uint)(fVar49 * 11.5 + auVar48._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  fVar49 = fVar54 - auVar37._0_4_;
  fVar5 = fVar54 - auVar41._0_4_;
  fVar6 = fVar54 - auVar42._0_4_;
  fVar7 = fVar54 - auVar43._0_4_;
  fVar8 = fVar54 - auVar39._0_4_;
  fVar54 = fVar54 - auVar40._0_4_;
  fVar56 = auVar44._0_4_;
  fVar9 = fVar56 - auVar42._0_4_;
  fVar10 = fVar56 - auVar43._0_4_;
  fVar11 = fVar56 - auVar39._0_4_;
  fVar12 = fVar56 - auVar40._0_4_;
  fVar13 = fVar56 - auVar45._0_4_;
  fVar14 = fVar56 - auVar46._0_4_;
  fVar15 = fVar56 - auVar47._0_4_;
  fVar56 = fVar56 - auVar38._0_4_;
  gauss_s1_c0[0] = expf(fVar57 * fVar3 * fVar3);
  gauss_s1_c0[1] = expf(fVar4 * fVar4 * fVar57);
  gauss_s1_c0[2] = expf(fVar49 * fVar49 * fVar57);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar57);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar57);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar57);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar57);
  gauss_s1_c0[8] = expf(fVar54 * fVar54 * fVar57);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar57);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar57);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar57);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar57);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar57);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar57);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar57);
  gauss_s1_c1[8] = expf(fVar56 * fVar56 * fVar57);
  auVar51 = ZEXT1264(ZEXT812(0));
  iVar17 = 0;
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  lVar24 = 0;
  uVar31 = 0xfffffffffffffff8;
  pfVar20 = haarResponseY;
  pfVar27 = haarResponseX;
  while (uVar29 = (uint)uVar31, (int)uVar29 < 8) {
    pfVar35 = gauss_s1_c0;
    lVar34 = (long)iVar17;
    lVar24 = (long)(int)lVar24;
    if (uVar29 == 7) {
      pfVar35 = gauss_s1_c1;
    }
    if (uVar29 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    uVar25 = 0;
    iVar17 = iVar17 + 4;
    uVar32 = 0xfffffffffffffff8;
    pfVar21 = pfVar20;
    pfVar28 = pfVar27;
    while (lVar34 != iVar17) {
      iVar19 = (int)uVar32;
      pfVar30 = gauss_s1_c0;
      auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar32 = (ulong)((uint)(uVar32 >> 0x1c) & 8);
      if (iVar19 == 7) {
        pfVar30 = gauss_s1_c1;
      }
      if (iVar19 == -8) {
        pfVar30 = gauss_s1_c1;
      }
      pfVar18 = pfVar28;
      pfVar22 = pfVar21;
      for (uVar26 = uVar25; uVar26 < iVar19 * 0x18 + 0x198; uVar26 = uVar26 + 0x18) {
        lVar23 = 0;
        pfVar36 = (float *)((long)pfVar35 + (ulong)(((uint)(uVar31 >> 0x1f) & 1) << 5));
        while (lVar23 != 9) {
          fVar49 = *pfVar36;
          pfVar36 = pfVar36 + (ulong)(~uVar29 >> 0x1f) * 2 + -1;
          pfVar1 = pfVar22 + lVar23;
          pfVar2 = pfVar18 + lVar23;
          lVar23 = lVar23 + 1;
          auVar42 = ZEXT416((uint)(pfVar30[uVar32] * fVar49 * *pfVar2));
          auVar37 = vandps_avx(auVar42,auVar41);
          auVar43 = ZEXT416((uint)(pfVar30[uVar32] * fVar49 * *pfVar1));
          auVar38 = vandps_avx(auVar43,auVar41);
          auVar42 = vinsertps_avx(auVar43,auVar42,0x10);
          auVar38 = vmovlhps_avx(auVar42,auVar38);
          auVar37 = vinsertps_avx(auVar38,auVar37,0x30);
          auVar55 = ZEXT1664(CONCAT412(auVar55._12_4_ + auVar37._12_4_,
                                       CONCAT48(auVar55._8_4_ + auVar37._8_4_,
                                                CONCAT44(auVar55._4_4_ + auVar37._4_4_,
                                                         auVar55._0_4_ + auVar37._0_4_))));
        }
        uVar32 = uVar32 + (ulong)(-1 < iVar19) * 2 + -1;
        pfVar18 = pfVar18 + 0x18;
        pfVar22 = pfVar22 + 0x18;
      }
      uVar32 = (ulong)(iVar19 + 5);
      uVar25 = uVar25 + 0x78;
      fVar49 = gauss_s2_arr[lVar34];
      auVar38._4_4_ = fVar49;
      auVar38._0_4_ = fVar49;
      auVar38._8_4_ = fVar49;
      auVar38._12_4_ = fVar49;
      auVar43 = vmulps_avx512vl(auVar55._0_16_,auVar38);
      lVar34 = lVar34 + 1;
      auVar45._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar45._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar45._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar45._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar38 = vshufpd_avx(auVar43,auVar43,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar24) = auVar43;
      lVar24 = lVar24 + 4;
      pfVar28 = pfVar28 + 0x78;
      pfVar21 = pfVar21 + 0x78;
      auVar37 = vmovshdup_avx(auVar45);
      auVar42 = vfmadd231ss_fma(auVar37,auVar43,auVar43);
      auVar37 = vshufps_avx(auVar43,auVar43,0xff);
      auVar38 = vfmadd213ss_fma(auVar38,auVar38,auVar42);
      auVar37 = vfmadd213ss_fma(auVar37,auVar37,auVar38);
      auVar51 = ZEXT464((uint)(auVar51._0_4_ + auVar37._0_4_));
    }
    pfVar27 = pfVar27 + 5;
    pfVar20 = pfVar20 + 5;
    uVar31 = (ulong)(uVar29 + 5);
  }
  if (auVar51._0_4_ < 0.0) {
    fVar49 = sqrtf(auVar51._0_4_);
  }
  else {
    auVar37 = vsqrtss_avx(auVar51._0_16_,auVar51._0_16_);
    fVar49 = auVar37._0_4_;
  }
  for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 1) {
    ipoint->descriptor[lVar24] = (1.0 / fVar49) * ipoint->descriptor[lVar24];
  }
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_pecompute_haar_rounding
        - replaced case statements with static arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary

    for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
        // int sample_y = (int) roundf(ipoint_y + l * scale);
        int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);// + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

        for (int k=-12, k_count=0; k<12; ++k, k_count++) {
            int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);// + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

            haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

        }

    }
        

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}